

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::SingularString::GenerateInlineAccessorDefinitions
          (SingularString *this,Printer *p)

{
  Descriptor *descriptor;
  initializer_list<google::protobuf::io::Printer::Sub> v;
  undefined1 auVar1 [8];
  bool bVar2;
  Descriptor *this_00;
  char *in_R9;
  string_view prefix;
  Sub *local_7c8;
  basic_string_view<char,_std::char_traits<char>_> local_730;
  basic_string_view<char,_std::char_traits<char>_> local_718;
  undefined1 local_701;
  anon_class_16_2_fd512ddd_for_cb local_700;
  allocator<char> local_6e9;
  string local_6e8;
  anon_class_16_2_fd512ddd_for_cb local_6c8;
  allocator<char> local_6b1;
  string local_6b0;
  basic_string_view<char,_std::char_traits<char>_> local_690;
  string local_680;
  allocator<char> local_659;
  string local_658;
  anon_class_16_2_fd512ddd_for_cb local_638;
  allocator<char> local_621;
  string local_620;
  anon_class_16_2_d7082a65_for_cb local_600;
  allocator<char> local_5e9;
  string local_5e8;
  anon_class_16_2_d7082a65_for_cb local_5c8;
  allocator<char> local_5b1;
  string local_5b0;
  anon_class_16_2_fd512ddd_for_cb local_590 [2];
  allocator<char> local_569;
  string local_568;
  Sub *local_548;
  Sub local_540;
  Sub local_488;
  Sub local_3d0;
  Sub local_318;
  Sub local_260;
  Sub local_1a8;
  Sub local_f0;
  iterator local_38;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_28;
  undefined1 local_18 [8];
  Printer *p_local;
  SingularString *this_local;
  
  local_701 = 1;
  local_548 = &local_540;
  local_18 = (undefined1  [8])p;
  p_local = (Printer *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_568,"if_IsDefault",&local_569)
  ;
  local_590[0].p = (Printer **)local_18;
  local_590[0].this = this;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::(anonymous_namespace)::SingularString::GenerateInlineAccessorDefinitions(google::protobuf::io::Printer*)const::__0>
            (&local_540,&local_568,local_590);
  local_548 = &local_488;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b0,"update_hasbit",&local_5b1);
  local_5c8.p = (Printer **)local_18;
  local_5c8.this = this;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::(anonymous_namespace)::SingularString::GenerateInlineAccessorDefinitions(google::protobuf::io::Printer*)const::__1>
            (&local_488,&local_5b0,&local_5c8);
  local_548 = &local_3d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5e8,"set_args",&local_5e9);
  local_600.p = (Printer **)local_18;
  local_600.this = this;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::(anonymous_namespace)::SingularString::GenerateInlineAccessorDefinitions(google::protobuf::io::Printer*)const::__2>
            (&local_3d0,&local_5e8,&local_600);
  local_548 = &local_318;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_620,"check_hasbit",&local_621)
  ;
  local_638.p = (Printer **)local_18;
  local_638.this = this;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::(anonymous_namespace)::SingularString::GenerateInlineAccessorDefinitions(google::protobuf::io::Printer*)const::__3>
            (&local_318,&local_620,&local_638);
  local_548 = &local_260;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_658,"release_name",&local_659)
  ;
  this_00 = FieldDescriptor::containing_type((this->super_FieldGeneratorBase).field_);
  descriptor = (Descriptor *)(this->super_FieldGeneratorBase).field_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_690,"release_");
  prefix._M_str = in_R9;
  prefix._M_len = (size_t)local_690._M_str;
  SafeFunctionName_abi_cxx11_
            (&local_680,(cpp *)this_00,descriptor,(FieldDescriptor *)local_690._M_len,prefix);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_260,&local_658,&local_680);
  local_548 = &local_1a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b0,"release_impl",&local_6b1)
  ;
  local_6c8.p = (Printer **)local_18;
  local_6c8.this = this;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::(anonymous_namespace)::SingularString::GenerateInlineAccessorDefinitions(google::protobuf::io::Printer*)const::__4>
            (&local_1a8,&local_6b0,&local_6c8);
  local_548 = &local_f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6e8,"set_allocated_impl",&local_6e9);
  local_700.p = (Printer **)local_18;
  local_700.this = this;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::(anonymous_namespace)::SingularString::GenerateInlineAccessorDefinitions(google::protobuf::io::Printer*)const::__5>
            (&local_f0,&local_6e8,&local_700);
  local_701 = 0;
  local_38 = &local_540;
  local_30 = 7;
  v._M_len = 7;
  v._M_array = local_38;
  absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_28._M_local_buf,v);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_718,
             "\n        inline const std::string& $Msg$::$name$() const\n            ABSL_ATTRIBUTE_LIFETIME_BOUND {\n          $WeakDescriptorSelfPin$;\n          $annotate_get$;\n          // @@protoc_insertion_point(field_get:$pkg.Msg.field$)\n          $if_IsDefault$;\n          return _internal_$name_internal$();\n        }\n        template <typename Arg_, typename... Args_>\n        inline PROTOBUF_ALWAYS_INLINE void $Msg$::set_$name$(Arg_&& arg,\n                                                             Args_... args) {\n          $WeakDescriptorSelfPin$;\n          $TsanDetectConcurrentMutation$;\n          $PrepareSplitMessageForWrite$;\n          $update_hasbit$;\n          $field_$.$Set$(static_cast<Arg_&&>(arg), args..., $set_args$);\n          $annotate_set$;\n          // @@protoc_insertion_point(field_set:$pkg.Msg.field$)\n        }\n        inline std::string* $Msg$::mutable_$name$() ABSL_ATTRIBUTE_LIFETIME_BOUND {\n          $WeakDescriptorSelfPin$;\n          $PrepareSplitMessageForWrite$;\n          std::string* _s = _internal_mutable_$name_internal$();\n          $annotate_mutable$;\n          // @@protoc_insertion_point(field_mutable:$pkg.Msg.field$)\n          return _s;\n        }\n        inline const std::string& $Msg$::_internal_$name_internal$() const {\n          $TsanDetectConcurrentRead$;\n          $check_hasbit$;\n          return $field_$.Get();\n        }\n        inline void $Msg$::_internal_set_$name_internal$(const std::string& value) {\n          $TsanDetectConcurrentMutation$;\n          $update_hasbit$;\n          //~ Don\'t use $Set$ here; we always want the std::string variant\n          //~ regardless of whether this is a `bytes` field.\n          $field_$.Set(value, $set_args$);\n        }\n        inline std::string* $Msg$::_internal_mutable_$name_internal$() {\n          $TsanDetectConcurrentMutation$;\n          $update_hasbit$;\n          return $field_$.Mutable($lazy_args$, $set_args$);\n        }\n        inline std::string* $Msg$::$release_name$() {\n          $WeakDescriptorSelfPin$;\n          $TsanDetectConcurrentMut..." /* TRUNCATED STRING LITERAL */
            );
  io::Printer::SourceLocation::current();
  google::protobuf::io::Printer::Emit
            (p,local_28._M_allocated_capacity,local_28._8_8_,local_718._M_len,local_718._M_str);
  local_7c8 = (Sub *)&local_38;
  do {
    local_7c8 = local_7c8 + -1;
    io::Printer::Sub::~Sub(local_7c8);
  } while (local_7c8 != &local_540);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::allocator<char>::~allocator(&local_6e9);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::allocator<char>::~allocator(&local_6b1);
  std::__cxx11::string::~string((string *)&local_680);
  std::__cxx11::string::~string((string *)&local_658);
  std::allocator<char>::~allocator(&local_659);
  std::__cxx11::string::~string((string *)&local_620);
  std::allocator<char>::~allocator(&local_621);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::allocator<char>::~allocator(&local_5e9);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::allocator<char>::~allocator(&local_5b1);
  std::__cxx11::string::~string((string *)&local_568);
  std::allocator<char>::~allocator(&local_569);
  bVar2 = FieldGeneratorBase::is_inlined(&this->super_FieldGeneratorBase);
  auVar1 = local_18;
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_730,
               "\n      inline bool $Msg$::_internal_$name_internal$_donated() const {\n        return $inlined_string_donated$;\n      }\n    "
              );
    io::Printer::SourceLocation::current();
    io::Printer::Emit((Printer *)auVar1,local_730._M_len,local_730._M_str);
  }
  return;
}

Assistant:

void SingularString::GenerateInlineAccessorDefinitions(io::Printer* p) const {
  p->Emit(
      {
          {"if_IsDefault",
           [&] {
             if (EmptyDefault() || is_oneof()) return;
             p->Emit(R"cc(
               if ($field_$.IsDefault()) {
                 return $default_variable_field$.get();
               }
             )cc");
           }},
          {"update_hasbit", [&] { UpdateHasbitSet(p, is_oneof()); }},
          {"set_args", [&] { ArgsForSetter(p, is_inlined()); }},
          {"check_hasbit",
           [&] {
             if (!is_oneof()) return;
             p->Emit(R"cc(
               if ($not_has_field$) {
                 return $kDefaultStr$;
               }
             )cc");
           }},
          {"release_name",
           SafeFunctionName(field_->containing_type(), field_, "release_")},
          {"release_impl", [&] { ReleaseImpl(p); }},
          {"set_allocated_impl", [&] { SetAllocatedImpl(p); }},
      },
      R"cc(
        inline const std::string& $Msg$::$name$() const
            ABSL_ATTRIBUTE_LIFETIME_BOUND {
          $WeakDescriptorSelfPin$;
          $annotate_get$;
          // @@protoc_insertion_point(field_get:$pkg.Msg.field$)
          $if_IsDefault$;
          return _internal_$name_internal$();
        }
        template <typename Arg_, typename... Args_>
        inline PROTOBUF_ALWAYS_INLINE void $Msg$::set_$name$(Arg_&& arg,
                                                             Args_... args) {
          $WeakDescriptorSelfPin$;
          $TsanDetectConcurrentMutation$;
          $PrepareSplitMessageForWrite$;
          $update_hasbit$;
          $field_$.$Set$(static_cast<Arg_&&>(arg), args..., $set_args$);
          $annotate_set$;
          // @@protoc_insertion_point(field_set:$pkg.Msg.field$)
        }
        inline std::string* $Msg$::mutable_$name$() ABSL_ATTRIBUTE_LIFETIME_BOUND {
          $WeakDescriptorSelfPin$;
          $PrepareSplitMessageForWrite$;
          std::string* _s = _internal_mutable_$name_internal$();
          $annotate_mutable$;
          // @@protoc_insertion_point(field_mutable:$pkg.Msg.field$)
          return _s;
        }
        inline const std::string& $Msg$::_internal_$name_internal$() const {
          $TsanDetectConcurrentRead$;
          $check_hasbit$;
          return $field_$.Get();
        }
        inline void $Msg$::_internal_set_$name_internal$(const std::string& value) {
          $TsanDetectConcurrentMutation$;
          $update_hasbit$;
          //~ Don't use $Set$ here; we always want the std::string variant
          //~ regardless of whether this is a `bytes` field.
          $field_$.Set(value, $set_args$);
        }
        inline std::string* $Msg$::_internal_mutable_$name_internal$() {
          $TsanDetectConcurrentMutation$;
          $update_hasbit$;
          return $field_$.Mutable($lazy_args$, $set_args$);
        }
        inline std::string* $Msg$::$release_name$() {
          $WeakDescriptorSelfPin$;
          $TsanDetectConcurrentMutation$;
          $annotate_release$;
          $PrepareSplitMessageForWrite$;
          // @@protoc_insertion_point(field_release:$pkg.Msg.field$)
          $release_impl$;
        }
        inline void $Msg$::set_allocated_$name$(std::string* value) {
          $WeakDescriptorSelfPin$;
          $TsanDetectConcurrentMutation$;
          $PrepareSplitMessageForWrite$;
          $set_allocated_impl$;
          $annotate_set$;
          // @@protoc_insertion_point(field_set_allocated:$pkg.Msg.field$)
        }
      )cc");

  if (is_inlined()) {
    p->Emit(R"cc(
      inline bool $Msg$::_internal_$name_internal$_donated() const {
        return $inlined_string_donated$;
      }
    )cc");
  }
}